

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::Cleanup(FunctionBody *this,bool isScriptContextClosing)

{
  undefined1 *puVar1;
  BYTE *address;
  ScriptContext *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((this->field_0x179 & 2) == 0) {
    puVar1 = &(this->counters).field_0x1;
    *puVar1 = *puVar1 | 2;
    CleanupRecyclerData(this,isScriptContextClosing,false);
    CleanUpForInCache(this,isScriptContextClosing);
    SetCountField(this,ObjLiteralCount,0);
    (this->super_ParseableFunctionInfo).scopeSlotArraySize = 0;
    (this->super_ParseableFunctionInfo).paramScopeSlotArraySize = 0;
    (this->super_ParseableFunctionInfo).super_FunctionProxy.auxPtrs.ptr =
         (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0;
    if ((((!isScriptContextClosing) && ((this->field_0x17d & 2) != 0)) &&
        ((this->byteCodeBlock).ptr != (ByteBlock *)0x0)) &&
       (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) != 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1e17,
                                  "(isScriptContextClosing || !m_hasActiveReference || !this->byteCodeBlock || !this->IsWasmFunction())"
                                  ,
                                  "We should never reset the bytecode block for Wasm when still referenced"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    (this->cacheIdToPropertyIdMap).ptr = (int *)0x0;
    (this->byteCodeBlock).ptr = (ByteBlock *)0x0;
    (this->entryPoints).ptr =
         (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
          *)0x0;
    (this->inlineCaches).ptr = (void **)0x0;
    (this->polymorphicInlineCaches).inlineCaches.ptr =
         (WriteBarrierPtr<Js::PolymorphicInlineCache> *)0x0;
    (this->polymorphicInlineCaches).inlineCacheCount = 0;
    Memory::Recycler::WBSetBit((char *)&this->m_constTable);
    (this->m_constTable).ptr = (WriteBarrierPtr<void> *)0x0;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_constTable);
    address = (BYTE *)(this->super_ParseableFunctionInfo).m_dynamicInterpreterThunk;
    if (address != (BYTE *)0x0 && !isScriptContextClosing) {
      this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
      if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0) {
        ScriptContext::ReleaseDynamicInterpreterThunk(this_00,address,true);
      }
      else {
        ScriptContext::ReleaseDynamicAsmJsInterpreterThunk(this_00,address,true);
      }
    }
    this->field_0x179 = this->field_0x179 | 2;
  }
  return;
}

Assistant:

void FunctionBody::Cleanup(bool isScriptContextClosing)
    {
        if (cleanedUp)
        {
            return;
        }

        DebugOnly(this->SetIsClosing());

        CleanupRecyclerData(isScriptContextClosing, false /* capture entry point cleanup stack trace */);
        CleanUpForInCache(isScriptContextClosing);

        this->SetObjLiteralCount(0);
        this->SetScopeSlotArraySizes(0, 0);

        // Manually clear these values to break any circular references
        // that might prevent the script context from being disposed
        this->auxPtrs = nullptr;
        AssertMsg(isScriptContextClosing || !m_hasActiveReference || !this->byteCodeBlock || !this->IsWasmFunction(), "We should never reset the bytecode block for Wasm when still referenced");
        this->byteCodeBlock = nullptr;
        this->entryPoints = nullptr;
        this->inlineCaches = nullptr;
        this->cacheIdToPropertyIdMap = nullptr;
        this->polymorphicInlineCaches.Reset();
        this->SetConstTable(nullptr);

#if DYNAMIC_INTERPRETER_THUNK
        if (this->HasInterpreterThunkGenerated())
        {
            JS_ETW(EtwTrace::LogMethodInterpreterThunkUnloadEvent(this));

            if (!isScriptContextClosing)
            {
                if (m_isAsmJsFunction)
                {
                    m_scriptContext->ReleaseDynamicAsmJsInterpreterThunk((BYTE*)this->m_dynamicInterpreterThunk, /*addtoFreeList*/ true);
                }
                else
                {
                    m_scriptContext->ReleaseDynamicInterpreterThunk((BYTE*)this->m_dynamicInterpreterThunk, /*addtoFreeList*/ true);
                }
            }
        }
#endif

        this->cleanedUp = true;
    }